

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

OPJ_BOOL bmp_read_file_header(FILE *IN,OPJ_BITMAPFILEHEADER *header)

{
  int iVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  bool bVar4;
  OPJ_BITMAPFILEHEADER *header_local;
  FILE *IN_local;
  
  iVar1 = getc((FILE *)IN);
  header->bfType = (OPJ_UINT16)iVar1;
  uVar2 = getc((FILE *)IN);
  header->bfType = header->bfType | (ushort)((uVar2 & 0xff) << 8);
  bVar4 = header->bfType == 0x4d42;
  if (bVar4) {
    OVar3 = getc((FILE *)IN);
    header->bfSize = OVar3;
    iVar1 = getc((FILE *)IN);
    header->bfSize = iVar1 << 8 | header->bfSize;
    iVar1 = getc((FILE *)IN);
    header->bfSize = iVar1 << 0x10 | header->bfSize;
    iVar1 = getc((FILE *)IN);
    header->bfSize = iVar1 << 0x18 | header->bfSize;
    iVar1 = getc((FILE *)IN);
    header->bfReserved1 = (OPJ_UINT16)iVar1;
    iVar1 = getc((FILE *)IN);
    header->bfReserved1 = header->bfReserved1 | (ushort)(iVar1 << 8);
    iVar1 = getc((FILE *)IN);
    header->bfReserved2 = (OPJ_UINT16)iVar1;
    iVar1 = getc((FILE *)IN);
    header->bfReserved2 = header->bfReserved2 | (ushort)(iVar1 << 8);
    OVar3 = getc((FILE *)IN);
    header->bfOffBits = OVar3;
    iVar1 = getc((FILE *)IN);
    header->bfOffBits = iVar1 << 8 | header->bfOffBits;
    iVar1 = getc((FILE *)IN);
    header->bfOffBits = iVar1 << 0x10 | header->bfOffBits;
    iVar1 = getc((FILE *)IN);
    header->bfOffBits = iVar1 << 0x18 | header->bfOffBits;
  }
  else {
    fprintf(_stderr,"Error, not a BMP file!\n");
  }
  IN_local._4_4_ = (uint)bVar4;
  return IN_local._4_4_;
}

Assistant:

static OPJ_BOOL bmp_read_file_header(FILE* IN, OPJ_BITMAPFILEHEADER* header)
{
    header->bfType  = (OPJ_UINT16)getc(IN);
    header->bfType |= (OPJ_UINT16)((OPJ_UINT32)getc(IN) << 8);

    if (header->bfType != 19778) {
        fprintf(stderr, "Error, not a BMP file!\n");
        return OPJ_FALSE;
    }

    /* FILE HEADER */
    /* ------------- */
    header->bfSize  = (OPJ_UINT32)getc(IN);
    header->bfSize |= (OPJ_UINT32)getc(IN) << 8;
    header->bfSize |= (OPJ_UINT32)getc(IN) << 16;
    header->bfSize |= (OPJ_UINT32)getc(IN) << 24;

    header->bfReserved1  = (OPJ_UINT16)getc(IN);
    header->bfReserved1 |= (OPJ_UINT16)((OPJ_UINT32)getc(IN) << 8);

    header->bfReserved2  = (OPJ_UINT16)getc(IN);
    header->bfReserved2 |= (OPJ_UINT16)((OPJ_UINT32)getc(IN) << 8);

    header->bfOffBits  = (OPJ_UINT32)getc(IN);
    header->bfOffBits |= (OPJ_UINT32)getc(IN) << 8;
    header->bfOffBits |= (OPJ_UINT32)getc(IN) << 16;
    header->bfOffBits |= (OPJ_UINT32)getc(IN) << 24;
    return OPJ_TRUE;
}